

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void * fio_realloc2(void *ptr,size_t new_size,size_t copy_length)

{
  ulong *__addr;
  ulong *puVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __len;
  
  if (ptr == (void *)0x0 || (longdouble *)ptr == &on_malloc_zero) {
LAB_0010b4f8:
    pvVar2 = fio_malloc(new_size);
    return pvVar2;
  }
  if (new_size == 0) {
    fio_free(ptr);
    new_size = 0;
    goto LAB_0010b4f8;
  }
  if (((uint)ptr & 0x7fff) == 0x10) {
    __addr = (ulong *)((long)ptr + -0x10);
    uVar4 = (ulong)((new_size + 0x10 & 0xfff) != 0) * 0x1000 +
            (new_size + 0x10 & 0xfffffffffffff000);
    uVar3 = *(ulong *)((long)ptr + -0x10);
    __len = uVar4 - uVar3;
    puVar1 = __addr;
    if (uVar4 < uVar3 || __len == 0) {
      if (uVar4 + 0x1000 < uVar3) {
        munmap((void *)((long)__addr + uVar4),uVar3 - uVar4);
      }
    }
    else {
      puVar1 = (ulong *)mremap(__addr,uVar3,uVar4,0);
      if (puVar1 == (ulong *)0x0) goto LAB_0010b55a;
      if ((puVar1 == (ulong *)0xffffffffffffffff) &&
         (pvVar2 = mmap((void *)(uVar3 + (long)__addr),__len,3,0x22,-1,0), puVar1 = __addr,
         pvVar2 != (void *)(uVar3 + (long)__addr))) {
        munmap(pvVar2,__len);
        puVar1 = (ulong *)sys_alloc(uVar4,'\x01');
        if (puVar1 == (ulong *)0x0) goto LAB_0010b55a;
        fio_memcpy(puVar1,__addr,uVar3 >> 4);
        munmap(__addr,uVar3);
      }
    }
    *puVar1 = uVar4;
    puVar1 = puVar1 + 2;
  }
  else {
    pvVar2 = fio_malloc(new_size);
    if (pvVar2 != (void *)0x0) {
      uVar4 = ((new_size >> 4) + 1) - (ulong)((new_size & 0xf) == 0);
      uVar3 = ((copy_length >> 4) + 1) - (ulong)((copy_length & 0xf) == 0);
      if (uVar4 <= uVar3) {
        uVar3 = uVar4;
      }
      fio_memcpy(pvVar2,ptr,uVar3);
      block_slice_free(ptr);
      return pvVar2;
    }
LAB_0010b55a:
    puVar1 = (ulong *)0x0;
  }
  return puVar1;
}

Assistant:

void *fio_realloc2(void *ptr, size_t new_size, size_t copy_length) {
  if (!ptr || ptr == (void *)&on_malloc_zero) {
    return fio_malloc(new_size);
  }
  if (!new_size) {
    goto zero_size;
  }
  if (((uintptr_t)ptr & FIO_MEMORY_BLOCK_MASK) == 16) {
    /* big reallocation - direct from the system */
    return big_realloc(ptr, new_size);
  }
  /* allocated within block - don't even try to expand the allocation */
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  void *new_mem = fio_malloc(new_size);
  if (!new_mem)
    return NULL;
  new_size = ((new_size >> 4) + (!!(new_size & 15)));
  copy_length = ((copy_length >> 4) + (!!(copy_length & 15)));
  fio_memcpy(new_mem, ptr, copy_length > new_size ? new_size : copy_length);

  block_slice_free(ptr);
  return new_mem;
zero_size:
  fio_free(ptr);
  return fio_malloc(0);
}